

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int EmitAlphaRGBA4444(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  byte bVar1;
  uint uVar2;
  WEBP_CSP_MODE WVar3;
  WebPDecBuffer *pWVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  byte bVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int num_rows;
  uint8_t *local_38;
  int local_2c;
  
  local_38 = io->a;
  if (local_38 != (uint8_t *)0x0) {
    uVar2 = io->mb_w;
    pWVar4 = p->output;
    WVar3 = pWVar4->colorspace;
    iVar5 = GetAlphaSourceRow(io,&local_38,&local_2c);
    if (0 < local_2c) {
      uVar7 = (ulong)(pWVar4->u).RGBA.stride;
      puVar9 = (pWVar4->u).RGBA.rgba + (long)iVar5 * uVar7;
      puVar10 = puVar9 + 1;
      bVar8 = 0xf;
      iVar5 = 0;
      puVar6 = local_38;
      do {
        if (0 < (int)uVar2) {
          uVar7 = 0;
          do {
            bVar1 = puVar6[uVar7];
            puVar10[uVar7 * 2] = puVar10[uVar7 * 2] & 0xf0 | bVar1 >> 4;
            bVar8 = bVar8 & bVar1 >> 4;
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
          uVar7 = (ulong)(uint)(pWVar4->u).RGBA.stride;
        }
        puVar6 = puVar6 + io->width;
        puVar10 = puVar10 + (int)uVar7;
        iVar5 = iVar5 + 1;
      } while (iVar5 != local_2c);
      if ((bVar8 != 0xf) && (0xfffffffb < WVar3 - MODE_YUV)) {
        (*WebPApplyAlphaMultiply4444)(puVar9,uVar2,local_2c,(int)uVar7);
      }
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGBA4444(const VP8Io* const io, WebPDecParams* const p,
                             int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const size_t start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + start_y * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
    uint8_t* alpha_dst = base_rgba;
#else
    uint8_t* alpha_dst = base_rgba + 1;
#endif
    uint32_t alpha_mask = 0x0f;
    int i, j;
    for (j = 0; j < num_rows; ++j) {
      for (i = 0; i < mb_w; ++i) {
        // Fill in the alpha value (converted to 4 bits).
        const uint32_t alpha_value = alpha[i] >> 4;
        alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
        alpha_mask &= alpha_value;
      }
      alpha += io->width;
      alpha_dst += buf->stride;
    }
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    if (alpha_mask != 0x0f && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply4444(base_rgba, mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}